

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.h
# Opt level: O0

int ZopfliGetDistExtraBits(int dist)

{
  int dist_local;
  undefined4 local_4;
  
  if (dist < 5) {
    local_4 = 0;
  }
  else {
    local_4 = 0x1f;
    if (dist - 1U != 0) {
      for (; dist - 1U >> local_4 == 0; local_4 = local_4 + -1) {
      }
    }
    local_4 = local_4 + -1;
  }
  return local_4;
}

Assistant:

static int ZopfliGetDistExtraBits(int dist) {
#ifdef ZOPFLI_HAS_BUILTIN_CLZ
  if (dist < 5) return 0;
  return (31 ^ __builtin_clz(dist - 1)) - 1; /* log2(dist - 1) - 1 */
#else
  if (dist < 5) return 0;
  else if (dist < 9) return 1;
  else if (dist < 17) return 2;
  else if (dist < 33) return 3;
  else if (dist < 65) return 4;
  else if (dist < 129) return 5;
  else if (dist < 257) return 6;
  else if (dist < 513) return 7;
  else if (dist < 1025) return 8;
  else if (dist < 2049) return 9;
  else if (dist < 4097) return 10;
  else if (dist < 8193) return 11;
  else if (dist < 16385) return 12;
  else return 13;
#endif
}